

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Widget::Widget(Widget *this)

{
  QHBoxLayout *pQVar1;
  PageView *pPVar2;
  TextLabel *pTVar3;
  QFont *pQVar4;
  QLatin1String local_118;
  QString local_108;
  WindowFlags local_ec;
  TextLabel *local_e8;
  TextLabel *page3;
  QString local_d0;
  WindowFlags local_b4;
  TextLabel *local_b0;
  TextLabel *page2;
  QString local_98;
  QFont local_80 [8];
  QFont f;
  Alignment local_6c;
  undefined1 local_68 [8];
  QTextOption opt;
  WindowFlags local_4c;
  TextLabel *local_48;
  TextLabel *page1;
  PageView *local_38;
  PageView *view;
  QHBoxLayout *local_20;
  QHBoxLayout *l;
  Widget *local_10;
  Widget *this_local;
  
  local_10 = this;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)((long)&l + 4));
  QWidget::QWidget(&this->super_QWidget,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)l._4_4_);
  *(undefined ***)this = &PTR_metaObject_00231390;
  *(undefined ***)&this->field_0x10 = &PTR__Widget_00231540;
  pQVar1 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar1,&this->super_QWidget);
  local_20 = pQVar1;
  pPVar2 = (PageView *)operator_new(0x30);
  QtMWidgets::PageView::PageView(pPVar2,&this->super_QWidget);
  pQVar1 = local_20;
  local_38 = pPVar2;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&page1 + 4));
  QBoxLayout::addWidget((QWidget *)pQVar1,(int)pPVar2,(QFlags_conflict1 *)0x0);
  pTVar3 = (TextLabel *)operator_new(0x30);
  pPVar2 = local_38;
  QFlags<Qt::WindowType>::QFlags(&local_4c);
  QtMWidgets::TextLabel::TextLabel(pTVar3,(QWidget *)pPVar2,local_4c);
  local_48 = pTVar3;
  QtMWidgets::TextLabel::textOption((TextLabel *)local_68);
  QFlags<Qt::AlignmentFlag>::QFlags(&local_6c,AlignCenter);
  QTextOption::setAlignment((QTextOption *)local_68,local_6c);
  pQVar4 = QWidget::font((QWidget *)local_48);
  QFont::QFont(local_80,pQVar4);
  QFont::setPointSize((int)local_80);
  QFont::setBold(local_80,true);
  QtMWidgets::TextLabel::setTextOption(local_48,(QTextOption *)local_68);
  QtMWidgets::TextLabel::setFont(local_48,local_80);
  pTVar3 = local_48;
  QLatin1String::QLatin1String((QLatin1String *)&page2,"1");
  QString::QString(&local_98,_page2);
  QtMWidgets::TextLabel::setText(pTVar3,&local_98);
  QString::~QString(&local_98);
  QtMWidgets::PageView::addWidget(local_38,(QWidget *)local_48);
  pTVar3 = (TextLabel *)operator_new(0x30);
  pPVar2 = local_38;
  QFlags<Qt::WindowType>::QFlags(&local_b4);
  QtMWidgets::TextLabel::TextLabel(pTVar3,(QWidget *)pPVar2,local_b4);
  local_b0 = pTVar3;
  QtMWidgets::TextLabel::setTextOption(pTVar3,(QTextOption *)local_68);
  QtMWidgets::TextLabel::setFont(local_b0,local_80);
  pTVar3 = local_b0;
  QLatin1String::QLatin1String((QLatin1String *)&page3,"2");
  QString::QString(&local_d0,_page3);
  QtMWidgets::TextLabel::setText(pTVar3,&local_d0);
  QString::~QString(&local_d0);
  QtMWidgets::PageView::addWidget(local_38,(QWidget *)local_b0);
  pTVar3 = (TextLabel *)operator_new(0x30);
  pPVar2 = local_38;
  QFlags<Qt::WindowType>::QFlags(&local_ec);
  QtMWidgets::TextLabel::TextLabel(pTVar3,(QWidget *)pPVar2,local_ec);
  local_e8 = pTVar3;
  QtMWidgets::TextLabel::setTextOption(pTVar3,(QTextOption *)local_68);
  QtMWidgets::TextLabel::setFont(local_e8,local_80);
  pTVar3 = local_e8;
  QLatin1String::QLatin1String(&local_118,"3");
  QString::QString(&local_108,local_118);
  QtMWidgets::TextLabel::setText(pTVar3,&local_108);
  QString::~QString(&local_108);
  QtMWidgets::PageView::addWidget(local_38,(QWidget *)local_e8);
  QWidget::resize(&this->super_QWidget,0x140,0x1e0);
  QFont::~QFont(local_80);
  QTextOption::~QTextOption((QTextOption *)local_68);
  return;
}

Assistant:

Widget()
	{
		QHBoxLayout * l = new QHBoxLayout( this );

		QtMWidgets::PageView * view = new QtMWidgets::PageView( this );

		l->addWidget( view );

		QtMWidgets::TextLabel * page1 = new QtMWidgets::TextLabel( view );

		QTextOption opt = page1->textOption();
		opt.setAlignment( Qt::AlignCenter );

		QFont f = page1->font();
		f.setPointSize( 150 );
		f.setBold( true );

		page1->setTextOption( opt );
		page1->setFont( f );
		page1->setText( QLatin1String( "1" ) );
		view->addWidget( page1 );

		QtMWidgets::TextLabel * page2 = new QtMWidgets::TextLabel( view );

		page2->setTextOption( opt );
		page2->setFont( f );
		page2->setText( QLatin1String( "2" ) );
		view->addWidget( page2 );

		QtMWidgets::TextLabel * page3 = new QtMWidgets::TextLabel( view );

		page3->setTextOption( opt );
		page3->setFont( f );
		page3->setText( QLatin1String( "3" ) );
		view->addWidget( page3 );

		resize( 320, 480 );
	}